

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoderData.c
# Opt level: O0

ZydisDecoderTreeNode * ZydisDecoderTreeGetChildNode(ZydisDecoderTreeNode *parent,ZyanU16 index)

{
  ZyanU16 index_local;
  ZydisDecoderTreeNode *parent_local;
  
  switch(parent->type) {
  case '\x01':
    if (0xc < index) {
      __assert_fail("index < 13",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x4a,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_XOP[parent->value] + index;
    break;
  case '\x02':
    if (0x10 < index) {
      __assert_fail("index < 17",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x4d,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_VEX[parent->value] + index;
    break;
  case '\x03':
    if (0x30 < index) {
      __assert_fail("index < 49",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x50,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_EMVEX[parent->value] + index;
    break;
  case '\x04':
    if (0xff < index) {
      __assert_fail("index < 256",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x53,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_OPCODE[parent->value] + index;
    break;
  case '\x05':
    if (3 < index) {
      __assert_fail("index < 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x56,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE[parent->value] + index;
    break;
  case '\x06':
    if (2 < index) {
      __assert_fail("index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x59,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_COMPACT[parent->value] + index;
    break;
  case '\a':
    if (3 < index) {
      __assert_fail("index < 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x5c,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODRM_MOD[parent->value] + index;
    break;
  case '\b':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x5f,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODRM_MOD_COMPACT[parent->value] + index;
    break;
  case '\t':
    if (7 < index) {
      __assert_fail("index < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x62,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODRM_REG[parent->value] + index;
    break;
  case '\n':
    if (7 < index) {
      __assert_fail("index < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x65,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODRM_RM[parent->value] + index;
    break;
  case '\v':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x68,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_PREFIX_GROUP1[parent->value] + index;
    break;
  case '\f':
    if (4 < index) {
      __assert_fail("index < 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x6b,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MANDATORY_PREFIX[parent->value] + index;
    break;
  case '\r':
    if (2 < index) {
      __assert_fail("index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x6e,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_OPERAND_SIZE[parent->value] + index;
    break;
  case '\x0e':
    if (2 < index) {
      __assert_fail("index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x71,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_ADDRESS_SIZE[parent->value] + index;
    break;
  case '\x0f':
    if (2 < index) {
      __assert_fail("index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x74,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_VECTOR_LENGTH[parent->value] + index;
    break;
  case '\x10':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x77,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_REX_W[parent->value] + index;
    break;
  case '\x11':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x7a,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_REX_B[parent->value] + index;
    break;
  case '\x12':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x7e,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_EVEX_B[parent->value] + index;
    break;
  case '\x13':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x83,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MVEX_E[parent->value] + index;
    break;
  case '\x14':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x87,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_AMD[parent->value] + index;
    break;
  case '\x15':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x8a,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_KNC[parent->value] + index;
    break;
  case '\x16':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x8d,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_MPX[parent->value] + index;
    break;
  case '\x17':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x90,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_CET[parent->value] + index;
    break;
  case '\x18':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x93,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_LZCNT[parent->value] + index;
    break;
  case '\x19':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x96,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_TZCNT[parent->value] + index;
    break;
  case '\x1a':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x99,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_WBNOINVD[parent->value] + index;
    break;
  case '\x1b':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x9c,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_CLDEMOTE[parent->value] + index;
    break;
  case '\x1c':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0x9f,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_IPREFETCH[parent->value] + index;
    break;
  case '\x1d':
    if (1 < index) {
      __assert_fail("index < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                    ,0xa2,
                    "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                   );
    }
    parent_local = FILTERS_MODE_UD0_COMPAT[parent->value] + index;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                  ,0xa5,
                  "const ZydisDecoderTreeNode *ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode *, ZyanU16)"
                 );
  }
  return parent_local;
}

Assistant:

const ZydisDecoderTreeNode* ZydisDecoderTreeGetChildNode(const ZydisDecoderTreeNode* parent,
    ZyanU16 index)
{
    switch (parent->type)
    {
    case ZYDIS_NODETYPE_FILTER_XOP:
        ZYAN_ASSERT(index <  13);
        return &FILTERS_XOP[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_VEX:
        ZYAN_ASSERT(index <  17);
        return &FILTERS_VEX[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_EMVEX:
        ZYAN_ASSERT(index <  49);
        return &FILTERS_EMVEX[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_OPCODE:
        ZYAN_ASSERT(index < 256);
        return &FILTERS_OPCODE[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE:
        ZYAN_ASSERT(index <   4);
        return &FILTERS_MODE[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
        ZYAN_ASSERT(index <   3);
        return &FILTERS_MODE_COMPACT[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
        ZYAN_ASSERT(index <   4);
        return &FILTERS_MODRM_MOD[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODRM_MOD_COMPACT[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODRM_REG:
        ZYAN_ASSERT(index <   8);
        return &FILTERS_MODRM_REG[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODRM_RM:
        ZYAN_ASSERT(index <   8);
        return &FILTERS_MODRM_RM[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
        ZYAN_ASSERT(index < 2);
        return &FILTERS_PREFIX_GROUP1[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
        ZYAN_ASSERT(index <   5);
        return &FILTERS_MANDATORY_PREFIX[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
        ZYAN_ASSERT(index <   3);
        return &FILTERS_OPERAND_SIZE[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
        ZYAN_ASSERT(index <   3);
        return &FILTERS_ADDRESS_SIZE[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
        ZYAN_ASSERT(index <   3);
        return &FILTERS_VECTOR_LENGTH[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_REX_W:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_REX_W[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_REX_B:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_REX_B[parent->value][index];
#ifndef ZYDIS_DISABLE_AVX512
    case ZYDIS_NODETYPE_FILTER_EVEX_B:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_EVEX_B[parent->value][index];
#endif
#ifndef ZYDIS_DISABLE_KNC
    case ZYDIS_NODETYPE_FILTER_MVEX_E:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MVEX_E[parent->value][index];
#endif
    case ZYDIS_NODETYPE_FILTER_MODE_AMD:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_AMD[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_KNC:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_KNC[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_MPX:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_MPX[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_CET:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_CET[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_LZCNT[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_TZCNT[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_WBNOINVD[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_CLDEMOTE[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_IPREFETCH:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_IPREFETCH[parent->value][index];
    case ZYDIS_NODETYPE_FILTER_MODE_UD0_COMPAT:
        ZYAN_ASSERT(index <   2);
        return &FILTERS_MODE_UD0_COMPAT[parent->value][index];
    default:
        ZYAN_UNREACHABLE;
    }
}